

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx512::forward_inplace
          (BatchNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  __m512 _p512_2;
  int i_2;
  __m512 _b512_2;
  __m512 _a512_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  __m512 _p512_1;
  int j;
  __m512 _b512_1;
  __m512 _a512_1;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  __m512 _b512;
  __m512 _a512;
  __m512 _p512;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_1440 [64];
  undefined1 local_13a0 [32];
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined1 local_1300 [64];
  undefined1 local_1260 [32];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  int local_1144;
  undefined1 (*local_1000) [64];
  int local_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  int local_f44;
  undefined1 (*local_e20) [64];
  int local_e18;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  int local_c98;
  undefined1 (*local_c90) [64];
  undefined1 (*local_c88) [64];
  undefined1 (*local_c80) [64];
  
  iVar15 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar12 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar13 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar15 == 1) {
    local_c80 = (undefined1 (*) [64])*in_RSI;
    local_c88 = *(undefined1 (**) [64])((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
    local_c90 = *(undefined1 (**) [64])((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240);
    iVar14 = iVar3 * iVar5;
    for (local_c98 = 0; local_c98 + 0xf < iVar14; local_c98 = local_c98 + 0x10) {
      auVar17 = vfmadd213ps_avx512f(*local_c90,*local_c80,*local_c88);
      local_d00 = auVar17._0_8_;
      uStack_cf8 = auVar17._8_8_;
      uStack_cf0 = auVar17._16_8_;
      uStack_ce8 = auVar17._24_8_;
      uStack_ce0 = auVar17._32_8_;
      uStack_cd8 = auVar17._40_8_;
      uStack_cd0 = auVar17._48_8_;
      uStack_cc8 = auVar17._56_8_;
      *(undefined8 *)*local_c80 = local_d00;
      *(undefined8 *)(*local_c80 + 8) = uStack_cf8;
      *(undefined8 *)(*local_c80 + 0x10) = uStack_cf0;
      *(undefined8 *)(*local_c80 + 0x18) = uStack_ce8;
      *(undefined8 *)(*local_c80 + 0x20) = uStack_ce0;
      *(undefined8 *)(*local_c80 + 0x28) = uStack_cd8;
      *(undefined8 *)(*local_c80 + 0x30) = uStack_cd0;
      *(undefined8 *)(*local_c80 + 0x38) = uStack_cc8;
      local_c80 = local_c80 + 1;
      local_c88 = local_c88 + 1;
      local_c90 = local_c90 + 1;
    }
    for (; local_c98 + 7 < iVar14; local_c98 = local_c98 + 8) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])*local_c90,*(undefined1 (*) [32])*local_c80,
                               *(undefined1 (*) [32])*local_c88);
      local_da0 = auVar6._0_8_;
      uStack_d98 = auVar6._8_8_;
      *(undefined8 *)*local_c80 = local_da0;
      *(undefined8 *)(*local_c80 + 8) = uStack_d98;
      *(undefined8 *)(*local_c80 + 0x10) = 0;
      *(undefined8 *)(*local_c80 + 0x18) = 0;
      local_c80 = (undefined1 (*) [64])(*local_c80 + 0x20);
      local_c88 = (undefined1 (*) [64])(*local_c88 + 0x20);
      local_c90 = (undefined1 (*) [64])(*local_c90 + 0x20);
    }
    for (; local_c98 + 3 < iVar14; local_c98 = local_c98 + 4) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_c90,*(undefined1 (*) [16])*local_c80,
                               *(undefined1 (*) [16])*local_c88);
      local_df0 = auVar6._0_8_;
      uStack_de8 = auVar6._8_8_;
      *(undefined8 *)*local_c80 = local_df0;
      *(undefined8 *)(*local_c80 + 8) = uStack_de8;
      local_c80 = (undefined1 (*) [64])(*local_c80 + 0x10);
      local_c88 = (undefined1 (*) [64])(*local_c88 + 0x10);
      local_c90 = (undefined1 (*) [64])(*local_c90 + 0x10);
    }
    for (; local_c98 < iVar14; local_c98 = local_c98 + 1) {
      *(float *)*local_c80 = *(float *)*local_c90 * *(float *)*local_c80 + *(float *)*local_c88;
      local_c80 = (undefined1 (*) [64])(*local_c80 + 4);
      local_c88 = (undefined1 (*) [64])(*local_c88 + 4);
      local_c90 = (undefined1 (*) [64])(*local_c90 + 4);
    }
  }
  if (iVar15 == 2) {
    iVar14 = iVar3 * iVar5;
    for (local_e18 = 0; local_e18 < (int)lVar12; local_e18 = local_e18 + 1) {
      local_e20 = (undefined1 (*) [64])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_e18 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_e18 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_e18 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_e18 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_e18 << 2) * 4);
        local_1220 = *puVar16;
        uStack_1218 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_1220 = CONCAT44(fVar2,fVar2);
        uStack_1218 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar19 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_e18 << 3) * 4);
        local_1260 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                      (long)(local_e18 << 3) * 4);
      }
      else {
        auVar19._8_8_ = uVar8;
        auVar19._0_8_ = uVar7;
        auVar19._24_8_ = uVar8;
        auVar19._16_8_ = uVar7;
        local_1260._8_8_ = uStack_1218;
        local_1260._0_8_ = local_1220;
        local_1260._24_8_ = uStack_1218;
        local_1260._16_8_ = local_1220;
      }
      if (iVar5 == 0x10) {
        auVar17 = *(undefined1 (*) [64])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_e18 << 4) * 4);
        local_1300 = *(undefined1 (*) [64])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                      (long)(local_e18 << 4) * 4);
      }
      else {
        auVar17 = vinsertf64x4_avx512f(ZEXT3264(auVar19),auVar19,1);
        local_1300 = vinsertf64x4_avx512f(ZEXT3264(local_1260),local_1260,1);
      }
      for (local_f44 = 0; local_f44 + 0xf < iVar14; local_f44 = local_f44 + 0x10) {
        auVar18 = vfmadd213ps_avx512f(local_1300,*local_e20,auVar17);
        local_fc0 = auVar18._0_8_;
        uStack_fb8 = auVar18._8_8_;
        uStack_fb0 = auVar18._16_8_;
        uStack_fa8 = auVar18._24_8_;
        uStack_fa0 = auVar18._32_8_;
        uStack_f98 = auVar18._40_8_;
        uStack_f90 = auVar18._48_8_;
        uStack_f88 = auVar18._56_8_;
        *(undefined8 *)*local_e20 = local_fc0;
        *(undefined8 *)(*local_e20 + 8) = uStack_fb8;
        *(undefined8 *)(*local_e20 + 0x10) = uStack_fb0;
        *(undefined8 *)(*local_e20 + 0x18) = uStack_fa8;
        *(undefined8 *)(*local_e20 + 0x20) = uStack_fa0;
        *(undefined8 *)(*local_e20 + 0x28) = uStack_f98;
        *(undefined8 *)(*local_e20 + 0x30) = uStack_f90;
        *(undefined8 *)(*local_e20 + 0x38) = uStack_f88;
        local_e20 = local_e20 + 1;
      }
      for (; local_f44 + 7 < iVar14; local_f44 = local_f44 + 8) {
        auVar6 = vfmadd213ps_fma(local_1260,*(undefined1 (*) [32])*local_e20,auVar19);
        local_fe0 = auVar6._0_8_;
        uStack_fd8 = auVar6._8_8_;
        *(undefined8 *)*local_e20 = local_fe0;
        *(undefined8 *)(*local_e20 + 8) = uStack_fd8;
        *(undefined8 *)(*local_e20 + 0x10) = 0;
        *(undefined8 *)(*local_e20 + 0x18) = 0;
        local_e20 = (undefined1 (*) [64])(*local_e20 + 0x20);
      }
      for (; local_f44 + 3 < iVar14; local_f44 = local_f44 + 4) {
        auVar9._8_8_ = uStack_1218;
        auVar9._0_8_ = local_1220;
        auVar6._8_8_ = uVar8;
        auVar6._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar9,*(undefined1 (*) [16])*local_e20,auVar6);
        local_ff0 = auVar6._0_8_;
        uStack_fe8 = auVar6._8_8_;
        *(undefined8 *)*local_e20 = local_ff0;
        *(undefined8 *)(*local_e20 + 8) = uStack_fe8;
        local_e20 = (undefined1 (*) [64])(*local_e20 + 0x10);
      }
      for (; local_f44 < iVar14; local_f44 = local_f44 + 1) {
        *(float *)*local_e20 = fVar2 * *(float *)*local_e20 + fVar1;
        local_e20 = (undefined1 (*) [64])(*local_e20 + 4);
      }
    }
  }
  if ((iVar15 == 3) || (iVar15 == 4)) {
    iVar15 = iVar3 * (int)lVar12 * iVar4 * iVar5;
    for (local_ff8 = 0; local_ff8 < (int)lVar13; local_ff8 = local_ff8 + 1) {
      local_1000 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_ff8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_ff8 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_ff8 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_ff8 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_ff8 << 2) * 4);
        local_1350 = *puVar16;
        uStack_1348 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_1350 = CONCAT44(fVar2,fVar2);
        uStack_1348 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar20 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_ff8 << 3) * 4);
        local_13a0 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                      (long)(local_ff8 << 3) * 4);
      }
      else {
        auVar20._8_8_ = uVar8;
        auVar20._0_8_ = uVar7;
        auVar20._24_8_ = uVar8;
        auVar20._16_8_ = uVar7;
        local_13a0._8_8_ = uStack_1348;
        local_13a0._0_8_ = local_1350;
        local_13a0._24_8_ = uStack_1348;
        local_13a0._16_8_ = local_1350;
      }
      if (iVar5 == 0x10) {
        auVar17 = *(undefined1 (*) [64])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_ff8 << 4) * 4);
        local_1440 = *(undefined1 (*) [64])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                      (long)(local_ff8 << 4) * 4);
      }
      else {
        auVar17 = vinsertf64x4_avx512f(ZEXT3264(auVar20),auVar20,1);
        local_1440 = vinsertf64x4_avx512f(ZEXT3264(local_13a0),local_13a0,1);
      }
      for (local_1144 = 0; local_1144 + 0xf < iVar15; local_1144 = local_1144 + 0x10) {
        auVar18 = vfmadd213ps_avx512f(local_1440,*local_1000,auVar17);
        local_11c0 = auVar18._0_8_;
        uStack_11b8 = auVar18._8_8_;
        uStack_11b0 = auVar18._16_8_;
        uStack_11a8 = auVar18._24_8_;
        uStack_11a0 = auVar18._32_8_;
        uStack_1198 = auVar18._40_8_;
        uStack_1190 = auVar18._48_8_;
        uStack_1188 = auVar18._56_8_;
        *(undefined8 *)*local_1000 = local_11c0;
        *(undefined8 *)(*local_1000 + 8) = uStack_11b8;
        *(undefined8 *)(*local_1000 + 0x10) = uStack_11b0;
        *(undefined8 *)(*local_1000 + 0x18) = uStack_11a8;
        *(undefined8 *)(*local_1000 + 0x20) = uStack_11a0;
        *(undefined8 *)(*local_1000 + 0x28) = uStack_1198;
        *(undefined8 *)(*local_1000 + 0x30) = uStack_1190;
        *(undefined8 *)(*local_1000 + 0x38) = uStack_1188;
        local_1000 = local_1000 + 1;
      }
      for (; local_1144 + 7 < iVar15; local_1144 = local_1144 + 8) {
        auVar6 = vfmadd213ps_fma(local_13a0,*(undefined1 (*) [32])*local_1000,auVar20);
        local_11e0 = auVar6._0_8_;
        uStack_11d8 = auVar6._8_8_;
        *(undefined8 *)*local_1000 = local_11e0;
        *(undefined8 *)(*local_1000 + 8) = uStack_11d8;
        *(undefined8 *)(*local_1000 + 0x10) = 0;
        *(undefined8 *)(*local_1000 + 0x18) = 0;
        local_1000 = (undefined1 (*) [64])(*local_1000 + 0x20);
      }
      for (; local_1144 + 3 < iVar15; local_1144 = local_1144 + 4) {
        auVar11._8_8_ = uStack_1348;
        auVar11._0_8_ = local_1350;
        auVar10._8_8_ = uVar8;
        auVar10._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar11,*(undefined1 (*) [16])*local_1000,auVar10);
        local_11f0 = auVar6._0_8_;
        uStack_11e8 = auVar6._8_8_;
        *(undefined8 *)*local_1000 = local_11f0;
        *(undefined8 *)(*local_1000 + 8) = uStack_11e8;
        local_1000 = (undefined1 (*) [64])(*local_1000 + 0x10);
      }
      for (; local_1144 < iVar15; local_1144 = local_1144 + 1) {
        *(float *)*local_1000 = fVar2 * *(float *)*local_1000 + fVar1;
        local_1000 = (undefined1 (*) [64])(*local_1000 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}